

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_no_value.hpp
# Opt level: O2

string_t * __thiscall
cfgfile::tag_no_value_t<cfgfile::qstring_trait_t>::print
          (string_t *__return_storage_ptr__,tag_no_value_t<cfgfile::qstring_trait_t> *this,
          int indent)

{
  undefined8 *puVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  QChar QVar4;
  undefined8 *puVar5;
  QArrayDataPointer<char16_t> QStack_48;
  
  (__return_storage_ptr__->m_str).d.d = (Data *)0x0;
  (__return_storage_ptr__->m_str).d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->m_str).d.size = 0;
  bVar2 = tag_t<cfgfile::qstring_trait_t>::is_defined(&this->super_tag_t<cfgfile::qstring_trait_t>);
  if (bVar2) {
    qstring_wrapper_t::qstring_wrapper_t
              ((qstring_wrapper_t *)&QStack_48,indent,const_t<cfgfile::qstring_trait_t>::c_tab);
    QString::append((QString *)__return_storage_ptr__);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
    QVar4.ucs = (char16_t)__return_storage_ptr__;
    QString::append(QVar4);
    QString::append((QString *)__return_storage_ptr__);
    iVar3 = (*(this->super_tag_t<cfgfile::qstring_trait_t>)._vptr_tag_t[2])(this);
    if (*(long *)CONCAT44(extraout_var,iVar3) != ((long *)CONCAT44(extraout_var,iVar3))[1]) {
      QString::append(QVar4);
      iVar3 = (*(this->super_tag_t<cfgfile::qstring_trait_t>)._vptr_tag_t[2])(this);
      puVar1 = (undefined8 *)((undefined8 *)CONCAT44(extraout_var_00,iVar3))[1];
      for (puVar5 = *(undefined8 **)CONCAT44(extraout_var_00,iVar3); puVar5 != puVar1;
          puVar5 = puVar5 + 1) {
        (**(code **)(*(long *)*puVar5 + 0x18))(&QStack_48,(long *)*puVar5,indent + 1);
        QString::append((QString *)__return_storage_ptr__);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
      }
      qstring_wrapper_t::qstring_wrapper_t
                ((qstring_wrapper_t *)&QStack_48,indent,const_t<cfgfile::qstring_trait_t>::c_tab);
      QString::append((QString *)__return_storage_ptr__);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
    }
    QString::append(QVar4);
    QString::append(QVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

typename Trait::string_t print( int indent = 0 ) const override
	{
		typename Trait::string_t result;

		if( this->is_defined() )
		{
			result.append( typename Trait::string_t( indent,
				const_t< Trait >::c_tab ) );

			result.push_back( const_t< Trait >::c_begin_tag );
			result.append( this->name() );

			if( !this->children().empty() )
			{
				result.push_back( const_t< Trait >::c_carriage_return );

				for( const tag_t< Trait > * tag : this->children() )
					result.append( tag->print( indent + 1 ) );

				result.append( typename Trait::string_t( indent,
					const_t< Trait >::c_tab ) );
			}

			result.push_back( const_t< Trait >::c_end_tag );
			result.push_back( const_t< Trait >::c_carriage_return );
		}

		return result;
	}